

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

EitherFlag * __thiscall
argstest::Matcher::GetLongOrAny(EitherFlag *__return_storage_ptr__,Matcher *this)

{
  bool bVar1;
  reference flag;
  reference pvVar2;
  _Node_iterator_base<char,_false> local_28;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_20;
  Matcher *local_18;
  Matcher *this_local;
  
  local_18 = this;
  this_local = (Matcher *)__return_storage_ptr__;
  bVar1 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->longFlags);
  if (bVar1) {
    bVar1 = std::unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_>::
            empty(&this->shortFlags);
    if (bVar1) {
      EitherFlag::EitherFlag(__return_storage_ptr__,' ');
    }
    else {
      local_28._M_cur =
           (__node_type *)
           std::unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_>::
           begin(&this->shortFlags);
      pvVar2 = std::__detail::_Node_const_iterator<char,_true,_false>::operator*
                         ((_Node_const_iterator<char,_true,_false> *)&local_28);
      EitherFlag::EitherFlag(__return_storage_ptr__,*pvVar2);
    }
  }
  else {
    local_20._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&this->longFlags);
    flag = std::__detail::
           _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
           ::operator*((_Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                        *)&local_20);
    EitherFlag::EitherFlag(__return_storage_ptr__,flag);
  }
  return __return_storage_ptr__;
}

Assistant:

EitherFlag GetLongOrAny() const
            {
                if (!longFlags.empty())
                {
                    return *longFlags.begin();
                }

                if (!shortFlags.empty())
                {
                    return *shortFlags.begin();
                }

                // should be unreachable
                return ' ';
            }